

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::AMRLink::Description::Description
          (Description *this,int level_,Point *refinement_,Bounds *core_,Bounds *bounds_)

{
  DynamicPoint<int,_4UL> *in_RDX;
  undefined4 in_ESI;
  Bounds<int> *in_RDI;
  DynamicPoint<int,_4UL> *in_R8;
  Bounds<int> *pBVar1;
  
  *(undefined4 *)&(in_RDI->min).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_> = in_ESI;
  pBVar1 = (Bounds<int> *)
           &(in_RDI->min).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  DynamicPoint<int,_4UL>::DynamicPoint(in_R8,in_RDX);
  Bounds<int>::Bounds(in_RDI,pBVar1);
  Bounds<int>::Bounds(in_RDI,pBVar1);
  return;
}

Assistant:

Description(int level_, Point refinement_, Bounds core_, Bounds bounds_):
                        level(level_), refinement(refinement_), core(core_), bounds(bounds_)    {}